

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_ext_instance_free(lysf_ctx *ctx,lysp_ext_instance *ext)

{
  lyplg_ext_parse_free_clb p_Var1;
  lysp_stmt *plVar2;
  lysp_ext_instance *plVar3;
  lysp_stmt *stmt;
  lysp_ext_instance *plVar4;
  long lVar5;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argument);
  ly_free_prefix_data(ext->format,ext->prefix_data);
  if ((ext->record != (lyplg_ext_record *)0x0) &&
     (p_Var1 = (ext->record->plugin).pfree, p_Var1 != (lyplg_ext_parse_free_clb)0x0)) {
    (*p_Var1)(ctx->ctx,ext);
  }
  stmt = ext->child;
  while (stmt != (lysp_stmt *)0x0) {
    plVar2 = stmt->next;
    lysp_stmt_free(ctx->ctx,stmt);
    stmt = plVar2;
  }
  lVar5 = 0;
  plVar4 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar3 = ext->exts;
    if (plVar3 == (lysp_ext_instance *)0x0) {
      return;
    }
    if (plVar3[-1].exts <= plVar4) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar5));
    plVar4 = (lysp_ext_instance *)((long)&plVar4->name + 1);
    lVar5 = lVar5 + 0x70;
  }
  free(&plVar3[-1].exts);
  return;
}

Assistant:

void
lysp_ext_instance_free(struct lysf_ctx *ctx, struct lysp_ext_instance *ext)
{
    struct lysp_stmt *stmt, *next;

    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argument);
    ly_free_prefix_data(ext->format, ext->prefix_data);
    if (ext->record && ext->record->plugin.pfree) {
        ext->record->plugin.pfree(ctx->ctx, ext);
    }

    LY_LIST_FOR_SAFE(ext->child, next, stmt) {
        lysp_stmt_free(ctx->ctx, stmt);
    }

    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
}